

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

int Abc_FlowRetime_GetLag(Abc_Obj_t *pObj)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsLatch(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                  ,0x52c,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
  }
  uVar2 = Abc_ObjId(pObj);
  iVar1 = Vec_IntSize(pManMR->vLags);
  if ((int)uVar2 < iVar1) {
    p = pManMR->vLags;
    uVar2 = Abc_ObjId(pObj);
    iVar1 = Vec_IntEntry(p,uVar2);
    return iVar1;
  }
  __assert_fail("(int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x52d,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
}

Assistant:

int 
Abc_FlowRetime_GetLag( Abc_Obj_t *pObj ) {
  assert( !Abc_ObjIsLatch(pObj) );
  assert( (int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags) );

  return Vec_IntEntry(pManMR->vLags, Abc_ObjId(pObj));
}